

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmbeddedClasses.cpp
# Opt level: O1

void __thiscall chatra::ContainerBase::extend(ContainerBase *this,size_t required)

{
  Object *pOVar1;
  pointer pRVar2;
  ContainerBody *pCVar3;
  ulong uVar4;
  Reference local_40;
  Reference local_38;
  
  if ((this->capacity < required) &&
     ((this->capacity != 0 ||
      (pOVar1 = ((this->super_ObjectBase).super_Object.refsArray.
                 super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>._M_impl.
                 super__Vector_impl_data._M_start)->node->object,
      uVar4 = (long)*(pointer *)
                     ((long)&(pOVar1->refsArray).
                             super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>
                             ._M_impl + 8) -
              *(long *)&(pOVar1->refsArray).
                        super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>.
                        _M_impl.super__Vector_impl_data >> 3, this->capacity = uVar4,
      uVar4 < required)))) {
    uVar4 = this->capacity * 3 >> 1;
    if (uVar4 <= required) {
      uVar4 = required;
    }
    this->capacity = uVar4;
    local_38.node =
         (this->super_ObjectBase).super_Object.refsArray.
         super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>._M_impl.
         super__Vector_impl_data._M_start[1].node;
    pCVar3 = Reference::allocateWithoutLock<chatra::ContainerBody,unsigned_long&>
                       (&local_38,&this->capacity);
    if (this->length != 0) {
      pOVar1 = ((this->super_ObjectBase).super_Object.refsArray.
                super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>._M_impl.
                super__Vector_impl_data._M_start)->node->object;
      uVar4 = 0;
      do {
        local_38.node =
             (pCVar3->super_Object).refsArray.
             super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>._M_impl.
             super__Vector_impl_data._M_start[uVar4].node;
        local_40.node =
             *(ReferenceNode **)
              (*(long *)&(pOVar1->refsArray).
                         super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>.
                         _M_impl.super__Vector_impl_data + uVar4 * 8);
        Reference::setWithoutBothLock(&local_38,&local_40);
        uVar4 = uVar4 + 1;
      } while (uVar4 < this->length);
    }
    pRVar2 = (this->super_ObjectBase).super_Object.refsArray.
             super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_38.node = pRVar2->node;
    local_40.node = pRVar2[1].node;
    Reference::setWithoutBothLock(&local_38,&local_40);
  }
  return;
}

Assistant:

void ContainerBase::extend(size_t required) {
	if (required <= capacity)
		return;

	if (capacity == 0) {
		capacity = ref(0).deref().size();
		if (required <= capacity)
			return;
	}

	capacity = std::max(required, capacity * 3 / 2);
	auto& o1 = ref(1).allocate<ContainerBody>(capacity);
	auto& o0 = ref(0).deref();
	for (size_t i = 0; i < length; i++)
		o1.ref(i).set(o0.ref(i));
	ref(0).set(ref(1));
}